

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arduino-rx-web.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 uVar1;
  void *__dest;
  size_type sVar2;
  undefined8 *in_RSI;
  uint in_EDI;
  bool isInitialized;
  int payloadLength;
  int captureId;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  size_t *in_stack_fffffffffffffce8;
  undefined6 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf6;
  undefined1 in_stack_fffffffffffffcf7;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffd00;
  anon_class_24_3_d79f260e *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  int iVar3;
  int iVar4;
  allocator *__rtime;
  int local_2bc;
  int local_28c;
  duration<long,std::ratio<1l,1000l>> local_288 [12];
  undefined4 local_27c;
  undefined1 *local_278;
  int *local_270;
  int *local_268;
  undefined1 *local_260;
  undefined1 local_254;
  byte local_253;
  byte local_252;
  undefined1 local_251 [40];
  allocator local_229;
  string local_228 [32];
  int local_208;
  byte local_203;
  byte local_202;
  allocator local_201;
  string local_200 [55];
  allocator local_1c9;
  string local_1c8 [36];
  int local_1a4;
  undefined1 local_1a0 [48];
  undefined1 local_170 [360];
  uint local_8;
  int local_4;
  
  local_4 = 0;
  local_8 = in_EDI;
  printf("Usage: %s [-cN] [-lN]\n",*in_RSI);
  printf("    -cN - select capture device N\n");
  printf("    -lN - fixed payload length of size N, N in [1, %d]\n",0x40);
  printf("\n");
  memset(local_170,0,0x160);
  memcpy(local_170,&PTR_anon_var_dwarf_48d1_0010fbf0,0x160);
  __dest = (void *)GGWave::Protocols::rx();
  memcpy(__dest,local_170,0x160);
  parseCmdArguments_abi_cxx11_((int)local_1a0,(char **)(ulong)local_8);
  std::allocator<char>::allocator();
  local_202 = 0;
  local_203 = 0;
  std::__cxx11::string::string(local_1c8,"c",&local_1c9);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(in_stack_fffffffffffffd00,
                  (key_type *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  if (sVar2 == 0) {
    local_2bc = 0;
  }
  else {
    std::allocator<char>::allocator();
    local_202 = 1;
    std::__cxx11::string::string(local_200,"c",&local_201);
    local_203 = 1;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
         (key_type *)in_stack_fffffffffffffd08);
    local_2bc = std::__cxx11::stoi((string *)
                                   CONCAT17(in_stack_fffffffffffffcf7,
                                            CONCAT16(in_stack_fffffffffffffcf6,
                                                     in_stack_fffffffffffffcf0)),
                                   in_stack_fffffffffffffce8,0);
  }
  if ((local_203 & 1) != 0) {
    std::__cxx11::string::~string(local_200);
  }
  if ((local_202 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
  }
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  local_1a4 = local_2bc;
  __rtime = &local_229;
  std::allocator<char>::allocator();
  local_252 = 0;
  local_253 = 0;
  std::__cxx11::string::string(local_228,"l",__rtime);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(in_stack_fffffffffffffd00,
                  (key_type *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  if (sVar2 == 0) {
    iVar3 = 0x10;
  }
  else {
    in_stack_fffffffffffffd08 = (anon_class_24_3_d79f260e *)local_251;
    std::allocator<char>::allocator();
    local_252 = 1;
    std::__cxx11::string::string
              ((string *)(local_251 + 1),"l",(allocator *)in_stack_fffffffffffffd08);
    local_253 = 1;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
         (key_type *)in_stack_fffffffffffffd08);
    iVar3 = std::__cxx11::stoi((string *)
                               CONCAT17(in_stack_fffffffffffffcf7,
                                        CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0
                                                )),in_stack_fffffffffffffce8,0);
  }
  iVar4 = iVar3;
  if ((local_253 & 1) != 0) {
    std::__cxx11::string::~string((string *)(local_251 + 1));
  }
  if ((local_252 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_251);
  }
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  local_254 = 0;
  local_270 = &local_1a4;
  local_268 = &local_208;
  local_260 = &local_254;
  local_208 = iVar3;
  std::function<bool()>::operator=
            ((function<bool_()> *)CONCAT44(iVar4,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd08);
  local_278 = &local_254;
  std::function<bool()>::operator=
            ((function<bool_()> *)CONCAT44(iVar4,in_stack_fffffffffffffd10),
             (anon_class_8_1_e681a16a *)in_stack_fffffffffffffd08);
  uVar1 = std::function<bool_()>::operator()
                    ((function<bool_()> *)
                     CONCAT17(in_stack_fffffffffffffcf7,
                              CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)));
  if ((bool)uVar1) {
    do {
      local_28c = 1;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_288,&local_28c);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)__rtime);
      in_stack_fffffffffffffcf6 =
           std::function<bool_()>::operator()
                     ((function<bool_()> *)
                      CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)))
      ;
    } while ((bool)in_stack_fffffffffffffcf6);
    GGWave_deinit();
    SDL_CloseAudio();
    SDL_Quit();
    local_4 = 0;
  }
  else {
    printf("Error: failed to initialize audio\n");
    local_4 = -2;
  }
  local_27c = 1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x108c1e);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
#ifdef __EMSCRIPTEN__
    printf("Build time: %s\n", BUILD_TIMESTAMP);
    printf("Press the Init button to start\n");

    if (argv[1]) {
        GGWave_setDefaultCaptureDeviceName(argv[1]);
    }
#else
    printf("Usage: %s [-cN] [-lN]\n", argv[0]);
    printf("    -cN - select capture device N\n");
    printf("    -lN - fixed payload length of size N, N in [1, %d]\n", GGWave::kMaxLengthFixed);
    printf("\n");
#endif

    GGWave::Protocols::rx() = { {
        { "[R2T2] Normal",      64,  9, 1, 2, true, },
        { "[R2T2] Fast",        64,  6, 1, 2, true, },
        { "[R2T2] Fastest",     64,  3, 1, 2, true, },
        { "[R2T2] Low Normal",  16,  9, 1, 2, true, },
        { "[R2T2] Low Fast",    16,  6, 1, 2, true, },
        { "[R2T2] Low Fastest", 16,  3, 1, 2, true, },
    } };

    const auto argm = parseCmdArguments(argc, argv);
    const int captureId = argm.count("c") == 0 ? 0 : std::stoi(argm.at("c"));
    const int payloadLength = argm.count("l") == 0 ? 16 : std::stoi(argm.at("l"));

    bool isInitialized = false;

    g_doInit = [&]() {
        if (GGWave_init(0, captureId, payloadLength, 0, true) == false) {
            fprintf(stderr, "Failed to initialize GGWave\n");
            return false;
        }

        isInitialized = true;
        printf("Listening for payload with length = %d bytes ..\n", payloadLength);

        return true;
    };

    g_mainUpdate = [&]() {
        if (isInitialized == false) {
            return true;
        }

        GGWave_mainLoop();

        return true;
    };

#ifdef __EMSCRIPTEN__
    emscripten_set_main_loop_arg(mainUpdate, NULL, 60, true);
#else
    if (g_doInit() == false) {
        printf("Error: failed to initialize audio\n");
        return -2;
    }

    while (true) {
        std::this_thread::sleep_for(std::chrono::milliseconds(1));
        if (g_mainUpdate() == false) break;
    }

    GGWave_deinit();

    // Cleanup
    SDL_CloseAudio();
    SDL_Quit();
#endif

    return 0;
}